

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

TimingControl * __thiscall
slang::ast::ContinuousAssignSymbol::getDelay(ContinuousAssignSymbol *this)

{
  TimingControlSyntax *pTVar1;
  SourceRange sourceRange;
  bool bVar2;
  Scope *visitor_00;
  SyntaxNode *pSVar3;
  ContinuousAssignSyntax *pCVar4;
  TimingControl **ppTVar5;
  Delay3Control *pDVar6;
  SourceLocation this_00;
  AssignmentExpression *this_01;
  SourceLocation SVar7;
  socklen_t __len;
  Symbol *in_RDI;
  LookupLocation LVar8;
  ExpressionVarVisitor visitor;
  Expression *left;
  Expression *expr;
  Delay3Control *d3;
  TimingControl *d;
  ASTContext context;
  TimingControlSyntax *delaySyntax;
  SyntaxNode *syntax;
  Scope *scope;
  void **in_stack_ffffffffffffff18;
  ASTContext *in_stack_ffffffffffffff28;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff30;
  undefined2 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3a;
  undefined1 in_stack_ffffffffffffff3e;
  ExpressionVarVisitor in_stack_ffffffffffffff3f;
  undefined8 in_stack_ffffffffffffff40;
  DiagCode code;
  bitmask<slang::ast::ASTFlags> local_98;
  Scope *local_90;
  uint32_t local_88;
  Scope *local_80;
  uint32_t local_78;
  sockaddr local_70;
  ContinuousAssignSymbol *in_stack_ffffffffffffffa8;
  TimingControl *local_8;
  
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional<const_slang::ast::TimingControl_*> *)0x489545);
  if (bVar2) {
    ppTVar5 = std::optional<const_slang::ast::TimingControl_*>::operator*
                        ((optional<const_slang::ast::TimingControl_*> *)0x489559);
    local_8 = *ppTVar5;
  }
  else {
    visitor_00 = Symbol::getParentScope(in_RDI);
    pSVar3 = Symbol::getSyntax(in_RDI);
    if (((visitor_00 == (Scope *)0x0) || (pSVar3 == (SyntaxNode *)0x0)) ||
       (pSVar3->parent == (SyntaxNode *)0x0)) {
      std::optional<slang::ast::TimingControl_const*>::operator=
                ((optional<const_slang::ast::TimingControl_*> *)in_RDI,in_stack_ffffffffffffff18);
      local_8 = (TimingControl *)0x0;
    }
    else {
      pCVar4 = slang::syntax::SyntaxNode::as<slang::syntax::ContinuousAssignSyntax>(pSVar3->parent);
      pTVar1 = pCVar4->delay;
      if (pTVar1 == (TimingControlSyntax *)0x0) {
        std::optional<slang::ast::TimingControl_const*>::operator=
                  ((optional<const_slang::ast::TimingControl_*> *)in_RDI,in_stack_ffffffffffffff18);
        local_8 = (TimingControl *)0x0;
      }
      else {
        LVar8 = LookupLocation::before(in_RDI);
        local_90 = LVar8.scope;
        local_88 = LVar8.index;
        local_80 = local_90;
        local_78 = local_88;
        bitmask<slang::ast::ASTFlags>::bitmask(&local_98,NonProcedural);
        LVar8.scope._2_4_ = in_stack_ffffffffffffff3a;
        LVar8.scope._0_2_ = in_stack_ffffffffffffff38;
        LVar8.scope._6_1_ = in_stack_ffffffffffffff3e;
        LVar8.scope._7_1_ = in_stack_ffffffffffffff3f.anyVars;
        LVar8._8_8_ = in_stack_ffffffffffffff40;
        ASTContext::ASTContext
                  (in_stack_ffffffffffffff28,(Scope *)in_RDI,LVar8,in_stack_ffffffffffffff30);
        TimingControl::bind((int)pTVar1,&local_70,__len);
        std::optional<slang::ast::TimingControl_const*>::operator=
                  ((optional<const_slang::ast::TimingControl_*> *)in_stack_ffffffffffffff30.m_bits,
                   (TimingControl **)in_stack_ffffffffffffff28);
        ppTVar5 = std::optional<const_slang::ast::TimingControl_*>::value
                            ((optional<const_slang::ast::TimingControl_*> *)in_RDI);
        if (((*ppTVar5)->kind == Delay3) &&
           (pDVar6 = TimingControl::as<slang::ast::Delay3Control>(*ppTVar5),
           pDVar6->expr2 != (Expression *)0x0)) {
          this_00 = (SourceLocation)getAssignment(in_stack_ffffffffffffffa8);
          code = SUB84((ulong)pDVar6 >> 0x20,0);
          if (*(int *)this_00 == 0xe) {
            this_01 = Expression::as<slang::ast::AssignmentExpression>((Expression *)this_00);
            SVar7 = (SourceLocation)AssignmentExpression::left(this_01);
            ExpressionVarVisitor::ExpressionVarVisitor
                      ((ExpressionVarVisitor *)&stack0xffffffffffffff3f);
            Expression::visit<slang::ast::ExpressionVarVisitor&>
                      ((Expression *)in_RDI,(ExpressionVarVisitor *)visitor_00);
            if ((in_stack_ffffffffffffff3f.anyVars & 1U) != 0) {
              sourceRange.endLoc = this_00;
              sourceRange.startLoc = SVar7;
              ASTContext::addDiag((ASTContext *)
                                  CONCAT17(in_stack_ffffffffffffff3f.anyVars,
                                           CONCAT16(in_stack_ffffffffffffff3e,
                                                    CONCAT42(0x2c0006,in_stack_ffffffffffffff38))),
                                  code,sourceRange);
            }
          }
        }
        ppTVar5 = std::optional<const_slang::ast::TimingControl_*>::operator*
                            ((optional<const_slang::ast::TimingControl_*> *)0x4897a6);
        local_8 = *ppTVar5;
      }
    }
  }
  return local_8;
}

Assistant:

const TimingControl* ContinuousAssignSymbol::getDelay() const {
    if (delay)
        return *delay;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    if (!scope || !syntax || !syntax->parent) {
        delay = nullptr;
        return nullptr;
    }

    auto delaySyntax = syntax->parent->as<ContinuousAssignSyntax>().delay;
    if (!delaySyntax) {
        delay = nullptr;
        return nullptr;
    }

    ASTContext context(*scope, LookupLocation::before(*this), ASTFlags::NonProcedural);
    delay = &TimingControl::bind(*delaySyntax, context);

    // A multi-delay is disallowed if the lhs references variables.
    auto& d = *delay.value();
    if (d.kind == TimingControlKind::Delay3) {
        auto& d3 = d.as<Delay3Control>();
        if (d3.expr2) {
            auto& expr = getAssignment();
            if (expr.kind == ExpressionKind::Assignment) {
                auto& left = expr.as<AssignmentExpression>().left();
                ExpressionVarVisitor visitor;
                left.visit(visitor);
                if (visitor.anyVars)
                    context.addDiag(diag::Delay3OnVar, left.sourceRange);
            }
        }
    }

    return *delay;
}